

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

void enet_host_bandwidth_throttle(ENetHost *host)

{
  ENetPeer *pEVar1;
  enet_uint32 eVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  ENetProtocol local_62;
  
  eVar2 = enet_time_get();
  uVar10 = eVar2 - host->bandwidthThrottleEpoch;
  bVar14 = host->bandwidthLimitedPeers != 0;
  if (999 < uVar10) {
    uVar11 = (uint)host->connectedPeers;
    host->bandwidthThrottleEpoch = eVar2;
    if (uVar11 != 0) {
      if (host->outgoingBandwidth == 0) {
        uVar12 = 0xffffffffffffffff;
        uVar5 = uVar12;
      }
      else {
        uVar12 = 0;
        for (sVar6 = 0; host->peerCount != sVar6; sVar6 = sVar6 + 1) {
          if (host->peer_list[sVar6]->state - ENET_PEER_STATE_CONNECTED < 2) {
            uVar12 = (ulong)((int)uVar12 + host->peer_list[sVar6]->outgoingDataTotal);
          }
        }
        uVar5 = (ulong)(host->outgoingBandwidth * uVar10) / 1000;
      }
      uVar5 = uVar5 & 0xffffffff;
      uVar13 = uVar11;
      while( true ) {
        uVar4 = (uint)uVar5;
        if ((uVar13 == 0) || (!bVar14)) break;
        iVar7 = 0x20;
        if (uVar4 < (uint)uVar12) {
          iVar7 = (int)((ulong)(uVar4 << 5) / (uVar12 & 0xffffffff));
        }
        sVar6 = host->peerCount;
        bVar14 = false;
        for (sVar9 = 0; sVar6 != sVar9; sVar9 = sVar9 + 1) {
          pEVar1 = host->peer_list[sVar9];
          if (((pEVar1->state - ENET_PEER_STATE_CONNECTED < 2) && (pEVar1->incomingBandwidth != 0))
             && (pEVar1->outgoingBandwidthThrottleEpoch != eVar2)) {
            uVar8 = (pEVar1->incomingBandwidth * uVar10) / 1000;
            uVar4 = pEVar1->outgoingDataTotal;
            if (uVar8 < uVar4 * iVar7 >> 5) {
              uVar3 = (uVar8 * 0x20) / uVar4;
              if (uVar8 * 0x20 < uVar4) {
                uVar3 = 1;
              }
              pEVar1->packetThrottleLimit = uVar3;
              if (uVar3 < pEVar1->packetThrottle) {
                pEVar1->packetThrottle = uVar3;
              }
              pEVar1->outgoingBandwidthThrottleEpoch = eVar2;
              pEVar1->incomingDataTotal = 0;
              pEVar1->outgoingDataTotal = 0;
              uVar13 = uVar13 - 1;
              uVar5 = (ulong)((int)uVar5 - uVar8);
              uVar12 = (ulong)((int)uVar12 - uVar8);
              bVar14 = true;
            }
          }
        }
      }
      if (uVar13 != 0) {
        if (uVar4 < (uint)uVar12) {
          uVar10 = (uint)((ulong)(uVar4 << 5) / (uVar12 & 0xffffffff));
        }
        else {
          uVar10 = 0x20;
        }
        sVar6 = host->peerCount;
        for (sVar9 = 0; sVar6 != sVar9; sVar9 = sVar9 + 1) {
          pEVar1 = host->peer_list[sVar9];
          if ((pEVar1->state - ENET_PEER_STATE_CONNECTED < 2) &&
             (pEVar1->outgoingBandwidthThrottleEpoch != eVar2)) {
            pEVar1->packetThrottleLimit = uVar10;
            if (uVar10 < pEVar1->packetThrottle) {
              pEVar1->packetThrottle = uVar10;
            }
            pEVar1->incomingDataTotal = 0;
            pEVar1->outgoingDataTotal = 0;
          }
        }
      }
      if (host->recalculateBandwidthLimits != 0) {
        host->recalculateBandwidthLimits = 0;
        uVar12 = (ulong)host->incomingBandwidth;
        if (host->incomingBandwidth == 0) {
          uVar10 = 0;
        }
        else {
          uVar5 = 0;
          bVar14 = true;
          while ((uVar10 = (uint)uVar5, uVar11 != 0 && (bVar14))) {
            uVar5 = uVar12 / uVar11;
            sVar6 = host->peerCount;
            bVar14 = false;
            for (sVar9 = 0; sVar6 != sVar9; sVar9 = sVar9 + 1) {
              pEVar1 = host->peer_list[sVar9];
              if (((pEVar1->state - ENET_PEER_STATE_CONNECTED < 2) &&
                  (pEVar1->incomingBandwidthThrottleEpoch != eVar2)) &&
                 ((uVar10 = pEVar1->outgoingBandwidth, uVar10 == 0 || (uVar10 < (uint)uVar5)))) {
                pEVar1->incomingBandwidthThrottleEpoch = eVar2;
                uVar11 = uVar11 - 1;
                uVar12 = (ulong)((int)uVar12 - uVar10);
                bVar14 = true;
              }
            }
          }
        }
        for (uVar12 = 0; uVar12 < host->peerCount; uVar12 = uVar12 + 1) {
          pEVar1 = host->peer_list[uVar12];
          if (pEVar1->state - ENET_PEER_STATE_CONNECTED < 2) {
            local_62._0_2_ = 0xff8a;
            uVar11 = host->outgoingBandwidth;
            local_62.sendFragment.fragmentCount =
                 uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
            ;
            local_62.connect.outgoingPeerID =
                 uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
            ;
            if (pEVar1->incomingBandwidthThrottleEpoch == eVar2) {
              uVar11 = pEVar1->outgoingBandwidth;
              local_62.connect.outgoingPeerID =
                   uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
            }
            enet_peer_queue_outgoing_command(pEVar1,&local_62,(ENetPacket *)0x0,0,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;
    int i;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

	for (i = 0; i < host -> peerCount; i++ )
        {
	    peer = host -> peer_list[i];

            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
            enet_uint32 peerBandwidth;
	    peer = host -> peer_list[i];
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
	    peer = host -> peer_list[i];

            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
		peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
	      continue;

	    peer -> packetThrottleLimit = throttle;

	    if (peer -> packetThrottle > peer -> packetThrottleLimit)
		peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
	}
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

	   for (i = 0; i < host -> peerCount; i++ )
	   {
	       peer = host -> peer_list[i];
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (i = 0; i < host -> peerCount; i++ )
       {
	   peer = host -> peer_list[i];

           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}